

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O0

uint __thiscall xercesc_4_0::NamespaceScope::increaseDepth(NamespaceScope *this)

{
  StackElem *this_00;
  NamespaceScope *this_local;
  
  if (this->fStackTop == this->fStackCapacity) {
    expandStack(this);
  }
  if (this->fStack[this->fStackTop] == (StackElem *)0x0) {
    this_00 = (StackElem *)XMemory::operator_new(0x10,this->fMemoryManager);
    StackElem::StackElem(this_00);
    this->fStack[this->fStackTop] = this_00;
    this->fStack[this->fStackTop]->fMapCapacity = 0;
    this->fStack[this->fStackTop]->fMap = (PrefMapElem *)0x0;
  }
  this->fStack[this->fStackTop]->fMapCount = 0;
  this->fStackTop = this->fStackTop + 1;
  return this->fStackTop - 1;
}

Assistant:

unsigned int NamespaceScope::increaseDepth()
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fMapCapacity = 0;
        fStack[fStackTop]->fMap = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fMapCount = 0;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}